

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::OfHelper
              (bool isTypedArrayEntryPoint,Arguments *args,ScriptContext *scriptContext)

{
  ImplicitCallFlags IVar1;
  RuntimeFunction *pRVar2;
  ThreadContext *this;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  Attributes attributes;
  int iVar7;
  undefined4 *puVar8;
  Var pvVar9;
  RuntimeFunction *function;
  JavascriptArray *this_00;
  JavascriptArray *this_01;
  TypedArrayBase *pTVar10;
  RecyclableObject *pRVar11;
  uint uVar12;
  uint32 itemIndex;
  ulong uVar13;
  anon_class_32_4_7a04c08f_for_newObjectCreationFunction local_b8;
  anon_class_32_4_7a04c08f_for_newObjectCreationFunction local_98;
  JavascriptArray *local_78;
  Arguments *local_70;
  undefined1 local_68 [8];
  JsReentLock jsReentLock;
  
  local_68 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_68)->noJsReentrancy;
  ((ThreadContext *)local_68)->noJsReentrancy = true;
  uVar12 = SUB84(args->Info,0);
  if (((ulong)args->Info & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x298a,"(args.Info.Count > 0)","args.Info.Count > 0");
    if (!bVar4) goto LAB_00a527e8;
    *puVar8 = 0;
    uVar12 = SUB84(args->Info,0);
  }
  local_70 = args;
  pvVar9 = Arguments::operator[](args,0);
  bVar4 = JavascriptOperators::IsConstructor(pvVar9);
  uVar12 = (uVar12 & 0xffffff) - 1;
  jsReentLock._24_8_ = ZEXT48(uVar12);
  if (bVar4) {
    pvVar9 = Arguments::operator[](local_70,0);
    function = (RuntimeFunction *)VarTo<Js::RecyclableObject>(pvVar9);
    pRVar2 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).arrayConstructor.ptr;
    bVar4 = function == pRVar2;
    bVar5 = JavascriptLibrary::IsTypedArrayConstructor(function,scriptContext);
    *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    this = scriptContext->threadContext;
    local_98.len = jsReentLock._24_4_;
    local_98.constructor = (RecyclableObject *)function;
    local_98.scriptContext = scriptContext;
    local_98.isTypedArrayEntryPoint = isTypedArrayEntryPoint;
    if (function == pRVar2 || bVar5) {
      bVar5 = this->reentrancySafeOrHandled;
      this->reentrancySafeOrHandled = true;
      this_00 = (JavascriptArray *)
                anon_func::anon_class_32_1_2f014396::
                anon_class_32_4_7a04c08f_for_newObjectCreationFunction::operator()(&local_98);
      this->reentrancySafeOrHandled = bVar5;
    }
    else {
      bVar5 = this->reentrancySafeOrHandled;
      this->reentrancySafeOrHandled = true;
      local_b8.constructor = (RecyclableObject *)function;
      local_b8.len = local_98.len;
      local_b8.scriptContext = scriptContext;
      local_b8.isTypedArrayEntryPoint = isTypedArrayEntryPoint;
      attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
      bVar6 = ThreadContext::HasNoSideEffect(this,(RecyclableObject *)function,attributes);
      if (bVar6) {
        this_00 = (JavascriptArray *)
                  anon_func::anon_class_32_1_2f014396::
                  anon_class_32_4_7a04c08f_for_newObjectCreationFunction::operator()(&local_b8);
        bVar6 = ThreadContext::IsOnStack(this_00);
LAB_00a52514:
        if (bVar6 != false) {
          this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
        }
      }
      else if ((this->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
        if ((attributes & HasNoSideEffect) != None) {
          this_00 = (JavascriptArray *)
                    anon_func::anon_class_32_1_2f014396::
                    anon_class_32_4_7a04c08f_for_newObjectCreationFunction::operator()(&local_b8);
          bVar6 = ThreadContext::IsOnStack(this_00);
          goto LAB_00a52514;
        }
        IVar1 = this->implicitCallFlags;
        this_00 = (JavascriptArray *)
                  anon_func::anon_class_32_1_2f014396::
                  anon_class_32_4_7a04c08f_for_newObjectCreationFunction::operator()(&local_b8);
        this->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      }
      else {
        this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
        this_00 = (JavascriptArray *)
                  (((((((((function->super_JavascriptFunction).super_DynamicObject.
                          super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                      super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                   javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
      }
      this->reentrancySafeOrHandled = bVar5;
    }
    JsReentLock::MutateArrayObject((JsReentLock *)local_68);
    *(bool *)((long)local_68 + 0x108) = true;
    this_01 = TryVarToNonES5Array(this_00);
    if (this_01 == (JavascriptArray *)0x0) {
      bVar5 = VarIs<Js::TypedArrayBase>(this_00);
      if (bVar5) {
        pTVar10 = UnsafeVarTo<Js::TypedArrayBase>(this_00);
      }
      else {
        pTVar10 = (TypedArrayBase *)0x0;
      }
      this_01 = (JavascriptArray *)0x0;
    }
    else {
      JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(this_01);
      JsReentLock::setObjectForMutation((JsReentLock *)local_68,this_01);
      pTVar10 = (TypedArrayBase *)0x0;
    }
  }
  else {
    if (isTypedArrayEntryPoint) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec40,L"[TypedArray].of");
    }
    this_00 = JavascriptLibrary::CreateArray
                        ((scriptContext->super_ScriptContextBase).javascriptLibrary,uVar12);
    EnsureHead<void*>(this_00);
    bVar4 = true;
    pTVar10 = (TypedArrayBase *)0x0;
    this_01 = this_00;
  }
  if (this_00 == (JavascriptArray *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x29c8,"(newObj)","newObj");
    if (!bVar5) {
LAB_00a527e8:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  local_78 = this_00;
  if (bVar4) {
    uVar13 = jsReentLock._24_8_ & 0xffffffff;
    itemIndex = 0;
    while (iVar7 = (int)uVar13, uVar13 = (ulong)(iVar7 - 1), iVar7 != 0) {
      pvVar9 = Arguments::operator[](local_70,itemIndex + 1);
      DirectSetItemAt<void*>(this_01,itemIndex,pvVar9);
      itemIndex = itemIndex + 1;
    }
  }
  else if (pTVar10 == (TypedArrayBase *)0x0) {
    uVar13 = jsReentLock._24_8_ & 0xffffffff;
    uVar12 = 0;
    while (iVar7 = (int)uVar13, uVar13 = (ulong)(iVar7 - 1), iVar7 != 0) {
      pvVar9 = Arguments::operator[](local_70,uVar12 + 1);
      *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      pRVar11 = VarTo<Js::RecyclableObject>(local_78);
      iVar7 = (*(pRVar11->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x29])(pRVar11,(ulong)uVar12,pvVar9,4);
      ThrowErrorOnFailure(iVar7,scriptContext,uVar12);
      JsReentLock::MutateArrayObject((JsReentLock *)local_68);
      *(bool *)((long)local_68 + 0x108) = true;
      uVar12 = uVar12 + 1;
    }
  }
  else {
    uVar13 = jsReentLock._24_8_ & 0xffffffff;
    uVar12 = 0;
    while (iVar7 = (int)uVar13, uVar13 = (ulong)(iVar7 - 1), iVar7 != 0) {
      pvVar9 = Arguments::operator[](local_70,uVar12 + 1);
      *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      (*(pTVar10->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
        super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x70])(pTVar10,(ulong)uVar12,pvVar9);
      JsReentLock::MutateArrayObject((JsReentLock *)local_68);
      *(bool *)((long)local_68 + 0x108) = true;
      uVar12 = uVar12 + 1;
    }
  }
  if (!isTypedArrayEntryPoint) {
    *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    pvVar9 = JavascriptNumber::ToVar(jsReentLock._24_4_,scriptContext);
    JavascriptOperators::OP_SetProperty
              (local_78,0xd1,pvVar9,scriptContext,(PropertyValueInfo *)0x0,
               PropertyOperation_ThrowIfNotExtensible,(Var)0x0);
    JsReentLock::MutateArrayObject((JsReentLock *)local_68);
    *(bool *)((long)local_68 + 0x108) = true;
  }
  ((ThreadContext *)local_68)->noJsReentrancy = (bool)jsReentLock.m_arrayObject2._0_1_;
  return local_78;
}

Assistant:

Var JavascriptArray::OfHelper(bool isTypedArrayEntryPoint, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        Assert(args.Info.Count > 0);

        // args.Info.Count cannot equal zero or we would have thrown above so no chance of underflowing
        uint32 len = args.Info.Count - 1;
        Var newObj = nullptr;
        JavascriptArray* newArr = nullptr;
        TypedArrayBase* newTypedArray = nullptr;
        bool isBuiltinArrayCtor = true;

        if (JavascriptOperators::IsConstructor(args[0]))
        {
            RecyclableObject* constructor = VarTo<RecyclableObject>(args[0]);
            isBuiltinArrayCtor = (constructor == scriptContext->GetLibrary()->GetArrayConstructor());
            bool isBuiltInTypedArrayCtor = JavascriptLibrary::IsTypedArrayConstructor(constructor, scriptContext);

            JS_REENTRANT
            (
                jsReentLock,
                newObj = JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isBuiltinArrayCtor || isBuiltInTypedArrayCtor, scriptContext->GetThreadContext(), [=]()->Js::Var
                {
                    Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(len, scriptContext) };
                    Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                    if (isTypedArrayEntryPoint)
                    {
                        return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), len, scriptContext);
                    }
                    else
                    {
                        return JavascriptOperators::NewScObject(constructor, Js::Arguments(constructorCallInfo, constructorArgs), scriptContext);
                    }
                });
            )

            // If the new object we created is an array, remember that as it will save us time setting properties in the object below
            newArr = JavascriptArray::TryVarToNonES5Array(newObj);
            if (newArr)
            {
#if ENABLE_COPYONACCESS_ARRAY
                JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(newArr);
#endif
                SETOBJECT_FOR_MUTATION(jsReentLock, newArr);

            }
            else if (VarIs<TypedArrayBase>(newObj))
            {
                newTypedArray = UnsafeVarTo<TypedArrayBase>(newObj);
            }
        }
        else
        {
            // We only throw when the constructor property is not a constructor function in the TypedArray version
            if (isTypedArrayEntryPoint)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedFunction, _u("[TypedArray].of"));
            }

            newArr = scriptContext->GetLibrary()->CreateArray(len);
            newArr->EnsureHead<Var>();
            newObj = newArr;
        }

        // At least we have a new object of some kind
        Assert(newObj);

        if (isBuiltinArrayCtor)
        {
            for (uint32 k = 0; k < len; k++)
            {
                Var kValue = args[k + 1];

                newArr->DirectSetItemAt(k, kValue);
            }
        }
        else if (newTypedArray)
        {
            for (uint32 k = 0; k < len; k++)
            {
                Var kValue = args[k + 1];

                JS_REENTRANT(jsReentLock, newTypedArray->DirectSetItem(k, kValue));
            }
        }
        else
        {
            for (uint32 k = 0; k < len; k++)
            {
                Var kValue = args[k + 1];
                JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(VarTo<RecyclableObject>(newObj), k, kValue), scriptContext, k));
            }
        }

        if (!isTypedArrayEntryPoint)
        {
            // Set length if we are in the Array version of the function
            JS_REENTRANT(jsReentLock, JavascriptOperators::OP_SetProperty(newObj, Js::PropertyIds::length, JavascriptNumber::ToVar(len, scriptContext), scriptContext, nullptr, PropertyOperation_ThrowIfNotExtensible));
        }

        return newObj;
    }